

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O1

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::LoadBean>,std::pair<int,int>>
               (AVisitor<hiberlite::LoadBean> *ar,
               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *v,uint param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_a0;
  pointer ppStack_98;
  pair<int,_int> local_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_68;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"items","");
  ppVar2 = (v->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_88,local_88 + local_80);
  local_90.first = 0;
  local_90.second = 0;
  local_a0 = v;
  ppStack_98 = ppVar2;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  paVar1 = &local_68.name.field_2;
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_c0,local_c0 + local_b8);
  local_68.stream.xx = local_90;
  local_68.stream.ct = local_a0;
  local_68.stream.it._M_current = ppStack_98;
  AVisitor<hiberlite::LoadBean>::operator&(ar,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}